

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date.cpp
# Opt level: O2

string * __thiscall
duckdb::Date::ToString_abi_cxx11_(string *__return_storage_ptr__,Date *this,date_t date)

{
  undefined **ppuVar1;
  idx_t iVar2;
  tuple<char_*,_std::default_delete<char[]>_> data;
  date_t d;
  bool add_bc;
  int32_t date_units [3];
  unique_ptr<char[],_std::default_delete<char>,_false> buffer;
  idx_t year_length;
  bool local_4d;
  allocator local_4c [4];
  int32_t local_48;
  int32_t local_44;
  __uniq_ptr_impl<char,_std::default_delete<char[]>_> local_40;
  idx_t local_38;
  
  d.days = (int32_t)this;
  if (d.days == -0x7fffffff) {
    ppuVar1 = &NINF;
  }
  else {
    if (d.days != 0x7fffffff) {
      Convert(d,(int32_t *)local_4c,&local_48,&local_44);
      iVar2 = DateToStringCast::YearLength((int32_t *)local_4c,&local_38,&local_4d);
      data.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
      super__Head_base<0UL,_char_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>)operator_new__(iVar2);
      local_40._M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
      super__Head_base<0UL,_char_*,_false>._M_head_impl =
           (tuple<char_*,_std::default_delete<char[]>_>)
           (tuple<char_*,_std::default_delete<char[]>_>)
           data.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
           super__Head_base<0UL,_char_*,_false>._M_head_impl;
      DateToStringCast::Format
                ((char *)data.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                         super__Head_base<0UL,_char_*,_false>._M_head_impl,(int32_t *)local_4c,
                 local_38,local_4d);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,
                 data.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                 super__Head_base<0UL,_char_*,_false>._M_head_impl,
                 (char *)(iVar2 + (long)data.
                                        super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>
                                        .super__Head_base<0UL,_char_*,_false>._M_head_impl));
      ::std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
                ((unique_ptr<char[],_std::default_delete<char[]>_> *)&local_40);
      return __return_storage_ptr__;
    }
    ppuVar1 = (undefined **)&PINF;
  }
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,*ppuVar1,local_4c);
  return __return_storage_ptr__;
}

Assistant:

string Date::ToString(date_t date) {
	// PG displays temporal infinities in lowercase,
	// but numerics in Titlecase.
	if (date == date_t::infinity()) {
		return PINF;
	} else if (date == date_t::ninfinity()) {
		return NINF;
	}
	int32_t date_units[3];
	idx_t year_length;
	bool add_bc;
	Date::Convert(date, date_units[0], date_units[1], date_units[2]);

	auto length = DateToStringCast::Length(date_units, year_length, add_bc);
	auto buffer = make_unsafe_uniq_array_uninitialized<char>(length);
	DateToStringCast::Format(buffer.get(), date_units, year_length, add_bc);
	return string(buffer.get(), length);
}